

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

BDD sylvan_serialize_get_reversed(size_t value)

{
  avl_node_t *paVar1;
  avl_node *paVar2;
  avl_node_t **ppaVar3;
  
  paVar2 = (avl_node *)(value & 0x7fffffffffffffff);
  if (paVar2 != (avl_node *)0x0) {
    ppaVar3 = &sylvan_ser_reversed_set;
    while( true ) {
      paVar1 = *ppaVar3;
      if (paVar1 == (avl_node_t *)0x0) {
        __assert_fail("ss != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                      ,0x8b8,"BDD sylvan_serialize_get_reversed(size_t)");
      }
      if (paVar1[1].right == paVar2) break;
      ppaVar3 = (avl_node_t **)(paVar1->pad + (ulong)(paVar1[1].right <= paVar2) * 8 + -0x14);
    }
    value = value & 0x8000000000000000 ^ (ulong)paVar1[1].left;
  }
  return value;
}

Assistant:

BDD
sylvan_serialize_get_reversed(size_t value)
{
    if (!sylvan_isnode(value)) return value;
    struct sylvan_ser s, *ss;
    s.assigned = BDD_STRIPMARK(value);
    ss = sylvan_ser_reversed_search(sylvan_ser_reversed_set, &s);
    assert(ss != NULL);
    return BDD_TRANSFERMARK(value, ss->bdd);
}